

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faup.c
# Opt level: O0

faup_handler_t * faup_init(faup_options_t *options)

{
  faup_options_t *pfVar1;
  int retval;
  faup_handler_t *fh;
  faup_options_t *options_local;
  
  options_local = (faup_options_t *)malloc(0xb8);
  if (options_local == (faup_options_t *)0x0) {
    fprintf(_stderr,"Could not allocate a faup_handler_t\n");
    options_local = (faup_options_t *)0x0;
  }
  else {
    options_local[1].quiet = (uint)(options != (faup_options_t *)0x0);
    options_local->sep_char = '\0';
    *(undefined4 *)((long)&options_local[1].snapshot_name + 4) = 0;
    memset(&options_local->input_source,0,0x90);
    if (options == (faup_options_t *)0x0) {
      pfVar1 = faup_options_new();
      *(faup_options_t **)(options_local + 2) = pfVar1;
    }
    else {
      *(faup_options_t **)(options_local + 2) = options;
    }
  }
  return (faup_handler_t *)options_local;
}

Assistant:

faup_handler_t *faup_init(faup_options_t *options)
{
    faup_handler_t *fh;
    int retval;

    fh = malloc(sizeof(faup_handler_t));
    if (!fh) {
      fprintf(stderr, "Could not allocate a faup_handler_t\n");
      return NULL;
    }
    fh->options_handled_externally = options?1:0;
    fh->faup.decoded = false;
    fh->faup.url_type = FAUP_URL_HAS_NO_TLD;
    memset(&fh->faup.features, 0, sizeof(fh->faup.features));

    if (options) {
        fh->options = options;
    } else {
        fh->options = faup_options_new();
    }
#ifdef FAUP_LUA_MODULES
    retval = faup_modules_new(fh);
#endif

	return fh;
}